

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O2

LispPTR COM_changedir(LispPTR *args)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  LispPTR LVar5;
  char *lf_cp;
  LispPTR *pLVar6;
  char *pcVar8;
  int *piVar9;
  long lVar10;
  DLword *pDVar11;
  char host [255];
  char lfname [4101];
  char dir [4096];
  long lVar7;
  
  pcVar8 = host;
  iVar3 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar3 == 0) {
    Lisp_errno = &Dummy_errno;
    pLVar6 = NativeAligned4FromLAddr(*args);
    if (*(char *)((long)pLVar6 + 6) == 'D') {
      iVar3 = pLVar6[2] * 2 + 5;
LAB_0011ba6c:
      iVar4 = 200;
      if (0x1005 < iVar3) goto LAB_0011ba18;
    }
    else {
      if (*(char *)((long)pLVar6 + 6) == 'C') {
        iVar3 = pLVar6[2] + 3;
        goto LAB_0011ba6c;
      }
      error("LispStringLength: Not a character array.\n");
    }
    pLVar6 = NativeAligned4FromLAddr(*args);
    LVar5 = 0x1000;
    if ((int)pLVar6[2] < 0x1000) {
      LVar5 = pLVar6[2];
    }
    lVar7 = (long)(int)LVar5;
    if (*(char *)((long)pLVar6 + 6) == 'D') {
      pDVar11 = Lisp_world + (ulong)(ushort)pLVar6[1] + (ulong)(*pLVar6 & 0xfffffff);
      for (lVar10 = 0; lVar7 != lVar10; lVar10 = lVar10 + 1) {
        lfname[lVar10] = *(char *)((ulong)pDVar11 ^ 2);
        pDVar11 = pDVar11 + 1;
      }
      lfname[lVar10] = '\0';
    }
    else if (*(char *)((long)pLVar6 + 6) == 'C') {
      uVar2 = *pLVar6;
      LVar5 = pLVar6[1];
      for (lVar10 = 0; lVar7 != lVar10; lVar10 = lVar10 + 1) {
        lfname[lVar10] =
             *(char *)((long)Lisp_world +
                       lVar10 + (ulong)(ushort)LVar5 + (ulong)(uVar2 & 0xfffffff) * 2 ^ 3);
      }
      lfname[lVar7] = '\0';
    }
    else {
      error("LispStringToCString: Not a character array.\n");
    }
    separate_host(lfname,host);
    for (; cVar1 = *pcVar8, cVar1 != '\0'; pcVar8 = pcVar8 + 1) {
      if ((byte)(cVar1 + 0x9fU) < 0x1a) {
        *pcVar8 = cVar1 + -0x20;
      }
    }
    if ((host._0_4_ != 0x4b5344) && (iVar3 = bcmp(host,"UNIX",5), iVar3 != 0)) {
      return 0;
    }
    iVar3 = unixpathname(lfname,dir,0,0);
    LVar5 = 0;
    if ((iVar3 != 0) &&
       ((host._0_4_ != 0x4b5344 || (iVar3 = true_name(dir), LVar5 = 0, iVar3 == -1)))) {
      alarm(TIMEOUT_TIME);
      piVar9 = __errno_location();
      do {
        *piVar9 = 0;
        iVar3 = chdir(dir);
        if (iVar3 != -1) break;
      } while (*piVar9 == 4);
      alarm(0);
      LVar5 = 0x4c;
      if (iVar3 != 0) {
        LVar5 = 0;
      }
    }
  }
  else {
    iVar4 = 100;
LAB_0011ba18:
    *Lisp_errno = iVar4;
    LVar5 = 0;
  }
  return LVar5;
}

Assistant:

LispPTR COM_changedir(LispPTR *args)
{
  int dskp, rval;
  char lfname[MAXPATHLEN + 5], dir[MAXPATHLEN], host[MAXNAMLEN];
#ifdef DOS
  char drive[1], rawname[MAXNAMLEN];
  int extlen;
#endif /* DOS */

  ERRSETJMP(NIL);
  Lisp_errno = &Dummy_errno;

  LispStringLength(args[0], rval, dskp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  rval = dskp ? rval + 4 + 1 : rval + 2 + 1;
  /* Add 5 for the host name field in Lisp format. */
  if (rval > MAXPATHLEN + 5) FileNameTooLong(NIL);

  LispStringToCString(args[0], lfname, MAXPATHLEN);
#ifdef DOS
  separate_host(lfname, host, drive);
#else
  separate_host(lfname, host);
#endif /* DOS */
  UPCASE(host);
  if (strcmp(host, "DSK") == 0)
    dskp = 1;
  else if (strcmp(host, "UNIX") == 0)
    dskp = 0;
  else
    return (NIL);

#ifdef DOS
  if (!unixpathname(lfname, dir, 0, 0, drive, 0, 0)) return (NIL);
#else  /* DOS */
  if (!unixpathname(lfname, dir, 0, 0)) return (NIL);
#endif /* DOS */

  if (dskp) {
    /*
     * If {DSK} device, the directory name can be specified in a case
     * insensitive manner.  We have to convert it into a right case.
     */
    if (true_name(dir) != -1) return (NIL);
  }

  TIMEOUT(rval = chdir(dir));
  if (rval != 0) return (NIL);
#ifdef DOS
  if (*drive) {
    if (*drive <= 'Z')
      rval = _chdrive(*drive - ('A' - 1));
    else
      rval = _chdrive(*drive - ('a' - 1));
    if (rval != 0) return (NIL);
  }
#endif /* DOS */
  return (ATOM_T);
}